

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

int __thiscall re2::Prog::ComputeFirstByte(Prog *this)

{
  byte bVar1;
  int iVar2;
  Inst *pIVar3;
  uint uVar4;
  bool bVar5;
  ostream *poVar6;
  uint uVar7;
  int *piVar8;
  SparseSet q;
  uint local_1cc;
  SparseSet local_1c8;
  LogMessage local_1b0;
  
  SparseSet::SparseSet(&local_1c8,this->size_);
  iVar2 = this->start_;
  bVar5 = SparseSet::contains(&local_1c8,iVar2);
  if (!bVar5) {
    SparseSet::insert_new(&local_1c8,iVar2);
  }
  if (local_1c8.size_ == 0) {
switchD_0012a64b_caseD_5:
    local_1cc = 0xffffffff;
  }
  else {
    local_1cc = 0xffffffff;
    piVar8 = local_1c8.dense_;
    do {
      iVar2 = *piVar8;
      pIVar3 = this->inst_;
      uVar7 = pIVar3[iVar2].out_opcode_;
      uVar4 = local_1cc;
      switch(uVar7 & 7) {
      case 0:
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc",
                   0x291,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0.str_,"unhandled ",10);
        poVar6 = (ostream *)
                 std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar3[iVar2].out_opcode_ & 7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," in ComputeFirstByte",0x14);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        break;
      case 1:
        if ((uVar7 & 8) != 0) {
          __assert_fail("!ip->last()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/nfa.cc"
                        ,0x2b8,"int re2::Prog::ComputeFirstByte()");
        }
        uVar7 = iVar2 + 1;
        bVar5 = SparseSet::contains(&local_1c8,uVar7);
joined_r0x0012a69e:
        if (!bVar5) {
          SparseSet::insert_new(&local_1c8,uVar7);
        }
        break;
      case 2:
        if ((uVar7 & 8) == 0) {
          bVar5 = SparseSet::contains(&local_1c8,iVar2 + 1);
          if (!bVar5) {
            SparseSet::insert_new(&local_1c8,iVar2 + 1);
          }
        }
        if ((pIVar3[iVar2].out_opcode_ & 7) != 2) {
          __assert_fail("(opcode()) == (kInstByteRange)",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                        ,0x6f,"int re2::Prog::Inst::lo()");
        }
        bVar1 = pIVar3[iVar2].field_1.field_3.lo_;
        if (((bVar1 != pIVar3[iVar2].field_1.field_3.hi_) ||
            (((byte)(bVar1 + 0x9f) < 0x1a && (pIVar3[iVar2].field_1.field_3.foldcase_ != '\0')))) ||
           ((uVar4 = (uint)bVar1, local_1cc != 0xffffffff && (uVar4 = local_1cc, local_1cc != bVar1)
            ))) goto switchD_0012a64b_caseD_5;
        break;
      default:
        if ((uVar7 & 8) == 0) {
          bVar5 = SparseSet::contains(&local_1c8,iVar2 + 1);
          if (!bVar5) {
            SparseSet::insert_new(&local_1c8,iVar2 + 1);
          }
        }
        if (0xf < pIVar3[iVar2].out_opcode_) {
          uVar7 = pIVar3[iVar2].out_opcode_ >> 4;
          bVar5 = SparseSet::contains(&local_1c8,uVar7);
          goto joined_r0x0012a69e;
        }
        break;
      case 5:
        goto switchD_0012a64b_caseD_5;
      case 7:
        break;
      }
      local_1cc = uVar4;
      piVar8 = piVar8 + 1;
    } while (piVar8 != local_1c8.dense_ + local_1c8.size_);
  }
  SparseSet::~SparseSet(&local_1c8);
  return local_1cc;
}

Assistant:

int Prog::ComputeFirstByte() {
  int b = -1;
  SparseSet q(size());
  q.insert(start());
  for (SparseSet::iterator it = q.begin(); it != q.end(); ++it) {
    int id = *it;
    Prog::Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled " << ip->opcode() << " in ComputeFirstByte";
        break;

      case kInstMatch:
        // The empty string matches: no first byte.
        return -1;

      case kInstByteRange:
        if (!ip->last())
          q.insert(id+1);

        // Must match only a single byte
        if (ip->lo() != ip->hi())
          return -1;
        if (ip->foldcase() && 'a' <= ip->lo() && ip->lo() <= 'z')
          return -1;
        // If we haven't seen any bytes yet, record it;
        // otherwise must match the one we saw before.
        if (b == -1)
          b = ip->lo();
        else if (b != ip->lo())
          return -1;
        break;

      case kInstNop:
      case kInstCapture:
      case kInstEmptyWidth:
        if (!ip->last())
          q.insert(id+1);

        // Continue on.
        // Ignore ip->empty() flags for kInstEmptyWidth
        // in order to be as conservative as possible
        // (assume all possible empty-width flags are true).
        if (ip->out())
          q.insert(ip->out());
        break;

      case kInstAltMatch:
        DCHECK(!ip->last());
        q.insert(id+1);
        break;

      case kInstFail:
        break;
    }
  }
  return b;
}